

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

void __thiscall asmjit::BaseBuilder::~BaseBuilder(BaseBuilder *this)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  
  (this->super_BaseEmitter)._vptr_BaseEmitter = (_func_int **)&PTR__BaseBuilder_001593b8;
  uVar3 = (ulong)(this->_passes).super_ZoneVectorBase._size;
  if (uVar3 != 0) {
    pvVar1 = (this->_passes).super_ZoneVectorBase._data;
    lVar2 = 0;
    do {
      (**(code **)**(undefined8 **)((long)pvVar1 + lVar2))();
      lVar2 = lVar2 + 8;
    } while (uVar3 << 3 != lVar2);
  }
  (this->_passes).super_ZoneVectorBase._data = (void *)0x0;
  (this->_passes).super_ZoneVectorBase._size = 0;
  (this->_passes).super_ZoneVectorBase._capacity = 0;
  ZoneAllocator::reset(&this->_allocator,(Zone *)0x0);
  Zone::reset(&this->_passZone,1);
  Zone::reset(&this->_dataZone,1);
  Zone::reset(&this->_codeZone,1);
  BaseEmitter::~BaseEmitter(&this->super_BaseEmitter);
  return;
}

Assistant:

BaseBuilder::~BaseBuilder() noexcept {
  BaseBuilder_deletePasses(this);
}